

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

GCproto * fs_finish(LexState *ls,BCLine line)

{
  FuncScope *pFVar1;
  int numline_00;
  ulong uVar2;
  lua_State *plVar3;
  size_t sVar4;
  long lVar5;
  GCproto *pt_00;
  int in_ESI;
  size_t *in_RDI;
  ptrdiff_t argbase;
  GCproto *pt;
  size_t ofsvar;
  size_t ofsdbg;
  size_t ofsli;
  size_t ofsuv;
  size_t ofsk;
  size_t sizept;
  BCLine numline;
  FuncState *fs;
  lua_State *L;
  GCproto *in_stack_ffffffffffffff28;
  FuncState *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  GCSize size;
  FuncState *in_stack_ffffffffffffff40;
  long lVar6;
  VMEvent ev;
  lua_State *L_00;
  undefined4 in_stack_ffffffffffffff70;
  FuncState *fs_00;
  FuncState *fs_01;
  FuncState *in_stack_ffffffffffffff98;
  LexState *in_stack_ffffffffffffffa0;
  
  size = (GCSize)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  fs_01 = (FuncState *)in_RDI[1];
  fs_00 = (FuncState *)*in_RDI;
  numline_00 = in_ESI - fs_00->linedefined;
  fs_fixup_ret(in_stack_ffffffffffffff40);
  uVar2 = (ulong)fs_00->pc * 4 + (ulong)fs_00->nkgc * 4 + 0x47 & 0xfffffffffffffff8;
  plVar3 = (lua_State *)
           ((long)(int)((fs_00->nuv + 1 & 0xfffffffe) << 1) + (ulong)fs_00->nkn * 8 + uVar2);
  L_00 = plVar3;
  sVar4 = fs_prep_line(fs_00,numline_00);
  lVar5 = (long)&(plVar3->nextgc).gcptr32 + sVar4;
  lVar6 = lVar5;
  sVar4 = fs_prep_var(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI);
  ev = (VMEvent)((ulong)lVar6 >> 0x20);
  pt_00 = (GCproto *)lj_mem_newgco((lua_State *)in_stack_ffffffffffffff40,size);
  pt_00->gct = '\a';
  pt_00->sizept = (int)sVar4 + (int)lVar5;
  pt_00->trace = 0;
  pt_00->flags = fs_00->flags & 0x9f;
  pt_00->numparams = fs_00->numparams;
  pt_00->framesize = fs_00->framesize;
  (pt_00->chunkname).gcptr32 = (uint32_t)in_RDI[0xd];
  *(undefined4 *)((long)pt_00 + (ulong)(fs_00->nkgc + 1) * -4 + uVar2) = 0;
  fs_fixup_bc(fs_00,pt_00,(BCIns *)(pt_00 + 1),fs_00->pc);
  fs_fixup_k(fs_01,(GCproto *)fs_00,(void *)CONCAT44(numline_00,in_stack_ffffffffffffff70));
  fs_fixup_uv1(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(uint16_t *)0x14f31d);
  fs_fixup_line(fs_00,pt_00,(void *)((long)&(pt_00->nextgc).gcptr32 + (long)&(L_00->nextgc).gcptr32)
                ,numline_00);
  fs_fixup_var((LexState *)in_stack_ffffffffffffff40,pt_00,(uint8_t *)in_stack_ffffffffffffff30,
               (size_t)in_stack_ffffffffffffff28);
  if (((*(byte *)((ulong)*(uint *)&fs_01->ls + 0x10b) & 1) != 0) &&
     (in_stack_ffffffffffffff30 = (FuncState *)lj_vmevent_prepare(L_00,ev),
     in_stack_ffffffffffffff30 != (FuncState *)0x0)) {
    pFVar1 = fs_01->bl;
    fs_01->bl = (FuncScope *)&pFVar1->vstart;
    *(int *)&pFVar1->prev = (int)pt_00;
    *(undefined4 *)((long)&pFVar1->prev + 4) = 0xfffffff8;
    lj_vmevent_call((lua_State *)in_stack_ffffffffffffff40,(ptrdiff_t)pt_00);
  }
  lj_memprof_add_proto((GCproto *)in_stack_ffffffffffffff30);
  lj_sysprof_add_proto((GCproto *)in_stack_ffffffffffffff30);
  fs_01->bl = (FuncScope *)&fs_01->bl[-1].vstart;
  *(MSize *)((long)in_RDI + 0x8c) = fs_00->vbase;
  *in_RDI = (size_t)fs_00->prev;
  return pt_00;
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif
#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}